

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O0

ByteArray *
ZXing::DataMatrix::Encode
          (wstring *msg,CharacterSet charset,SymbolShape shape,int minWidth,int minHeight,
          int maxWidth,int maxHeight)

{
  wstring_view ss;
  wstring_view ss_00;
  wstring_view s;
  wstring_view ss_01;
  wstring_view s_00;
  wstring_view ss_02;
  wstring_view s_01;
  wstring_view s_02;
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  SymbolInfo *this;
  EncoderContext *pEVar5;
  SymbolShape in_ECX;
  char in_DL;
  wstring *in_RSI;
  EncoderContext *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int capacity;
  SymbolInfo *symbolInfo;
  int len;
  int encodingMode;
  wstring_view MACRO_TRAILER;
  wstring_view MACRO_06_HEADER;
  wstring_view MACRO_05_HEADER;
  EncoderContext context;
  undefined7 in_stack_fffffffffffffe08;
  uint8_t in_stack_fffffffffffffe0f;
  EncoderContext *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  EncoderContext *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  int in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe64;
  undefined1 in_stack_fffffffffffffe66;
  string *psVar6;
  undefined4 in_stack_fffffffffffffe90;
  int iVar7;
  wchar_t *context_00;
  string local_a8 [32];
  EncoderContext local_88;
  int local_20;
  int local_1c;
  SymbolShape local_18;
  char local_11;
  wstring *local_10;
  
  local_11 = in_DL;
  if (in_DL == '\0') {
    local_11 = '\x02';
  }
  psVar6 = local_a8;
  pEVar5 = in_RDI;
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_10 = in_RSI;
  TextEncoder::FromUnicode
            ((wstring *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (CharacterSet)((uint)in_stack_fffffffffffffe24 >> 0x18));
  EncoderContext::EncoderContext
            (in_stack_fffffffffffffe30,
             (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::__cxx11::string::~string(local_a8);
  EncoderContext::setSymbolShape(&local_88,local_18);
  EncoderContext::setSizeConstraints
            (&local_88,local_1c,local_20,in_stack_00000008,in_stack_00000010);
  context_00 = L"[)>\x1e05\x1d";
  std::__cxx11::wstring::operator_cast_to_basic_string_view(local_10);
  s._M_len._4_4_ = in_stack_fffffffffffffe3c;
  s._M_len._0_4_ = in_stack_fffffffffffffe38;
  s._M_str._0_4_ = in_stack_fffffffffffffe40;
  s._M_str._4_4_ = in_stack_fffffffffffffe44;
  ss._M_len._4_4_ = in_stack_fffffffffffffe2c;
  ss._M_len._0_4_ = in_stack_fffffffffffffe28;
  ss._M_str = (wchar_t *)in_stack_fffffffffffffe30;
  uVar1 = StartsWith(s,ss);
  if ((bool)uVar1) {
    std::__cxx11::wstring::operator_cast_to_basic_string_view(local_10);
    s_01._M_str._0_7_ = in_stack_fffffffffffffe50;
    s_01._M_len = in_stack_fffffffffffffe48;
    s_01._M_str._7_1_ = in_stack_fffffffffffffe57;
    ss_01._M_len._4_4_ = in_stack_fffffffffffffe3c;
    ss_01._M_len._0_4_ = in_stack_fffffffffffffe38;
    ss_01._M_str._0_4_ = in_stack_fffffffffffffe40;
    ss_01._M_str._4_4_ = in_stack_fffffffffffffe44;
    in_stack_fffffffffffffe66 = EndsWith(s_01,ss_01);
    if ((bool)in_stack_fffffffffffffe66) {
      EncoderContext::addCodeword(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0f);
      EncoderContext::setSkipAtEnd(&local_88,2);
      in_stack_fffffffffffffe60 =
           Size<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                      in_stack_fffffffffffffe10);
      EncoderContext::setCurrentPos(&local_88,in_stack_fffffffffffffe60);
      goto LAB_0027fda8;
    }
  }
  std::__cxx11::wstring::operator_cast_to_basic_string_view(local_10);
  s_00._M_len._4_4_ = in_stack_fffffffffffffe3c;
  s_00._M_len._0_4_ = in_stack_fffffffffffffe38;
  s_00._M_str._0_4_ = in_stack_fffffffffffffe40;
  s_00._M_str._4_4_ = in_stack_fffffffffffffe44;
  ss_00._M_len._4_4_ = in_stack_fffffffffffffe2c;
  ss_00._M_len._0_4_ = in_stack_fffffffffffffe28;
  ss_00._M_str = (wchar_t *)in_stack_fffffffffffffe30;
  bVar2 = StartsWith(s_00,ss_00);
  if (bVar2) {
    std::__cxx11::wstring::operator_cast_to_basic_string_view(local_10);
    s_02._M_str._0_7_ = in_stack_fffffffffffffe50;
    s_02._M_len = in_stack_fffffffffffffe48;
    s_02._M_str._7_1_ = in_stack_fffffffffffffe57;
    ss_02._M_len._4_4_ = in_stack_fffffffffffffe3c;
    ss_02._M_len._0_4_ = in_stack_fffffffffffffe38;
    ss_02._M_str._0_4_ = in_stack_fffffffffffffe40;
    ss_02._M_str._4_4_ = in_stack_fffffffffffffe44;
    bVar2 = EndsWith(s_02,ss_02);
    if (bVar2) {
      EncoderContext::addCodeword(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0f);
      EncoderContext::setSkipAtEnd(&local_88,2);
      iVar7 = Size<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                        ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                         in_stack_fffffffffffffe10);
      EncoderContext::setCurrentPos(&local_88,iVar7);
    }
  }
LAB_0027fda8:
  iVar7 = 0;
  while( true ) {
    bVar2 = EncoderContext::hasMoreCharacters(in_stack_fffffffffffffe10);
    iVar4 = (int)((ulong)psVar6 >> 0x20);
    if (!bVar2) break;
    switch(iVar7) {
    case 0:
      ASCIIEncoder::EncodeASCII((EncoderContext *)CONCAT17(bVar2,in_stack_fffffffffffffe50));
      break;
    case 1:
      C40Encoder::EncodeC40
                ((EncoderContext *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      break;
    case 2:
      DMTextEncoder::EncodeText
                ((EncoderContext *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      break;
    case 3:
      X12Encoder::EncodeX12
                ((EncoderContext *)
                 CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe66,
                                         CONCAT24(in_stack_fffffffffffffe64,
                                                  in_stack_fffffffffffffe60))));
      break;
    case 4:
      EdifactEncoder::EncodeEdifact((EncoderContext *)CONCAT44(iVar7,in_stack_fffffffffffffe90));
      break;
    case 5:
      Base256Encoder::EncodeBase256((EncoderContext *)context_00);
    }
    in_stack_fffffffffffffe44 = EncoderContext::newEncoding(&local_88);
    if (-1 < in_stack_fffffffffffffe44) {
      in_stack_fffffffffffffe40 = EncoderContext::newEncoding(&local_88);
      iVar7 = in_stack_fffffffffffffe40;
      EncoderContext::clearNewEncoding(&local_88);
    }
  }
  iVar3 = EncoderContext::codewordCount((EncoderContext *)0x27febd);
  this = EncoderContext::updateSymbolInfo(pEVar5,iVar4);
  iVar4 = SymbolInfo::dataCapacity(this);
  if ((((iVar3 < iVar4) && (iVar7 != 0)) && (iVar7 != 5)) && (iVar7 != 4)) {
    EncoderContext::addCodeword(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0f);
  }
  iVar7 = EncoderContext::codewordCount((EncoderContext *)0x27ff61);
  if (iVar7 < iVar4) {
    EncoderContext::addCodeword(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0f);
  }
  while (iVar7 = EncoderContext::codewordCount((EncoderContext *)0x27ff96), iVar7 < iVar4) {
    EncoderContext::codewordCount((EncoderContext *)0x27ffb3);
    Randomize253State((uint8_t)((ulong)in_stack_fffffffffffffe10 >> 0x38),
                      (int)in_stack_fffffffffffffe10);
    EncoderContext::addCodeword(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0f);
  }
  pEVar5 = (EncoderContext *)EncoderContext::codewords(&local_88);
  ByteArray::ByteArray
            ((ByteArray *)pEVar5,
             (ByteArray *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  EncoderContext::~EncoderContext(pEVar5);
  return (ByteArray *)in_RDI;
}

Assistant:

ByteArray Encode(const std::wstring& msg, CharacterSet charset, SymbolShape shape, int minWidth, int minHeight, int maxWidth, int maxHeight)
{
	//the codewords 0..255 are encoded as Unicode characters
	//Encoder[] encoders = {
	//	new ASCIIEncoder(), new C40Encoder(), new TextEncoder(),
	//	new X12Encoder(), new EdifactEncoder(),  new Base256Encoder()
	//};

	if (charset == CharacterSet::Unknown) {
		charset = CharacterSet::ISO8859_1;
	}

	EncoderContext context(TextEncoder::FromUnicode(msg, charset));
	context.setSymbolShape(shape);
	context.setSizeConstraints(minWidth, minHeight, maxWidth, maxHeight);

	constexpr std::wstring_view MACRO_05_HEADER = L"[)>\x1E""05\x1D";
	constexpr std::wstring_view MACRO_06_HEADER = L"[)>\x1E""06\x1D";
	constexpr std::wstring_view MACRO_TRAILER = L"\x1E\x04";

	if (StartsWith(msg, MACRO_05_HEADER) && EndsWith(msg, MACRO_TRAILER)) {
		context.addCodeword(MACRO_05);
		context.setSkipAtEnd(2);
		context.setCurrentPos(Size(MACRO_05_HEADER));
	}
	else if (StartsWith(msg, MACRO_06_HEADER) && EndsWith(msg, MACRO_TRAILER)) {
		context.addCodeword(MACRO_06);
		context.setSkipAtEnd(2);
		context.setCurrentPos(Size(MACRO_06_HEADER));
	}

	int encodingMode = ASCII_ENCODATION; //Default mode
	while (context.hasMoreCharacters()) {
		switch (encodingMode) {
		case ASCII_ENCODATION:   ASCIIEncoder::EncodeASCII(context);     break;
		case C40_ENCODATION:     C40Encoder::EncodeC40(context);         break;
		case TEXT_ENCODATION:    DMTextEncoder::EncodeText(context);     break;
		case X12_ENCODATION:     X12Encoder::EncodeX12(context);         break;
		case EDIFACT_ENCODATION: EdifactEncoder::EncodeEdifact(context); break;
		case BASE256_ENCODATION: Base256Encoder::EncodeBase256(context); break;
		}
		if (context.newEncoding() >= 0) {
			encodingMode = context.newEncoding();
			context.clearNewEncoding();
		}
	}
	int len = context.codewordCount();
	auto symbolInfo = context.updateSymbolInfo(len);
	int capacity = symbolInfo->dataCapacity();
	if (len < capacity) {
		if (encodingMode != ASCII_ENCODATION && encodingMode != BASE256_ENCODATION && encodingMode != EDIFACT_ENCODATION) {
			context.addCodeword('\xfe'); //Unlatch (254)
		}
	}
	//Padding
	if (context.codewordCount() < capacity) {
		context.addCodeword(PAD);
	}
	while (context.codewordCount() < capacity) {
		context.addCodeword(Randomize253State(PAD, context.codewordCount() + 1));
	}

	return context.codewords();
}